

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Content.cpp
# Opt level: O1

CharacterSet __thiscall ZXing::Content::guessEncoding(Content *this)

{
  CharacterSet CVar1;
  pointer pEVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  ByteArray input;
  uint8_t *local_38;
  uint8_t *puStack_30;
  long local_28;
  
  local_38 = (uint8_t *)0x0;
  puStack_30 = (uint8_t *)0x0;
  local_28 = 0;
  pEVar2 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pEVar2 == (this->encodings).
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->hasECI != false) goto LAB_00132fb3;
    puVar6 = (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = (long)(*(int *)&(this->bytes).
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (int)puVar6);
  }
  else {
    lVar4 = (long)pEVar2->pos;
    if (lVar4 == 0 || (this->hasECI & 1U) != 0) goto LAB_00132fb3;
    puVar6 = (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,0,puVar6,
             puVar6 + lVar4);
LAB_00132fb3:
  pEVar2 = (this->encodings).
           super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(this->encodings).
                        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) >> 3;
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      uVar8 = uVar7 + 1;
      if (uVar8 == (uVar5 & 0xffffffff)) {
        iVar3 = *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                *(int *)&(this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      }
      else {
        iVar3 = pEVar2[uVar7 + 1].pos;
      }
      if ((pEVar2[uVar7].pos != iVar3) && (pEVar2[uVar7].eci == Unknown)) {
        puVar6 = (this->bytes).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_38,puStack_30,
                   puVar6 + pEVar2[uVar7].pos,puVar6 + iVar3);
      }
      pEVar2 = (this->encodings).
               super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (ulong)((long)(this->encodings).
                            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2) >> 3;
      uVar7 = uVar8;
    } while ((long)uVar8 < (long)(int)uVar5);
  }
  if (local_38 == puStack_30) {
    CVar1 = Unknown;
  }
  else {
    CVar1 = TextDecoder::GuessEncoding(local_38,(long)puStack_30 - (long)local_38,ISO8859_1);
  }
  if (local_38 != (uint8_t *)0x0) {
    operator_delete(local_38,local_28 - (long)local_38);
  }
  return CVar1;
}

Assistant:

CharacterSet Content::guessEncoding() const
{
	// assemble all blocks with unknown encoding
	ByteArray input;
	ForEachECIBlock([&](ECI eci, int begin, int end) {
		if (eci == ECI::Unknown)
			input.insert(input.end(), bytes.begin() + begin, bytes.begin() + end);
	});

	if (input.empty())
		return CharacterSet::Unknown;

	return TextDecoder::GuessEncoding(input.data(), input.size(), CharacterSet::ISO8859_1);
}